

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O1

unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> __thiscall
duckdb::ParquetReader::CreateReaderRecursive
          (ParquetReader *this,ClientContext *context,vector<duckdb::ColumnIndex,_true> *indexes,
          ParquetColumnSchema *schema)

{
  vector<duckdb::ParquetColumnSchema,_true> *this_00;
  byte bVar1;
  int iVar2;
  __buckets_ptr pp_Var3;
  __buckets_ptr pp_Var4;
  _Head_base<0UL,_duckdb::ColumnReader_*,_false> _Var5;
  undefined8 uVar6;
  ParquetFileMetadataCache *pPVar7;
  ParquetReader *reader;
  RowNumberColumnReader *this_01;
  const_reference pvVar8;
  reference pvVar9;
  ListColumnReader *this_02;
  InternalException *pIVar10;
  size_type __n;
  size_type sVar11;
  ClientContext *in_R8;
  vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
  children;
  undefined1 local_78 [40];
  element_type *local_50;
  vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
  local_48;
  
  iVar2 = *(int *)&(in_R8->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                   internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
  local_78._32_8_ = this;
  local_50 = (element_type *)indexes;
  if (iVar2 == 0) {
    pp_Var3 = *(__buckets_ptr *)((long)&(in_R8->config).profiler_save_location.field_2 + 8);
    pp_Var4 = (in_R8->config).profiler_settings._M_h._M_buckets;
    if (pp_Var3 == pp_Var4) {
      ColumnReader::CreateReader
                ((ColumnReader *)this,(ParquetReader *)context,(ParquetColumnSchema *)in_R8);
    }
    else {
      local_48.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      ::resize(&local_48,((long)pp_Var4 - (long)pp_Var3 >> 4) * -0x71c71c71c71c71c7);
      this_00 = (vector<duckdb::ParquetColumnSchema,_true> *)
                ((long)&(in_R8->config).profiler_save_location.field_2 + 8);
      if (*(pointer *)schema == (schema->name)._M_dataplus._M_p) {
        if ((in_R8->config).profiler_settings._M_h._M_buckets !=
            *(__buckets_ptr *)((long)&(in_R8->config).profiler_save_location.field_2 + 8)) {
          sVar11 = 0;
          do {
            vector<duckdb::ParquetColumnSchema,_true>::operator[](this_00,sVar11);
            CreateReaderRecursive
                      ((ParquetReader *)local_78,context,
                       (vector<duckdb::ColumnIndex,_true> *)local_50,schema);
            pvVar9 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
                     ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
                                   *)&local_48,sVar11);
            uVar6 = local_78._0_8_;
            local_78._0_8_ =
                 (tuple<duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>)0x0;
            _Var5._M_head_impl =
                 (pvVar9->
                 super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>
                 .super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl;
            (pvVar9->
            super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)._M_t
            .super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>
            .super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl =
                 (ColumnReader *)uVar6;
            if (_Var5._M_head_impl != (ColumnReader *)0x0) {
              (**(code **)((long)(_Var5._M_head_impl)->_vptr_ColumnReader + 8))();
            }
            if ((ColumnReader *)local_78._0_8_ != (ColumnReader *)0x0) {
              (*(*(_func_int ***)local_78._0_8_)[1])();
            }
            sVar11 = sVar11 + 1;
          } while (sVar11 < (ulong)(((long)(in_R8->config).profiler_settings._M_h._M_buckets -
                                     *(long *)((long)&(in_R8->config).profiler_save_location.field_2
                                              + 8) >> 4) * -0x71c71c71c71c71c7));
        }
      }
      else if ((schema->name)._M_dataplus._M_p != *(pointer *)schema) {
        __n = 0;
        do {
          pvVar8 = vector<duckdb::ColumnIndex,_true>::operator[]
                             ((vector<duckdb::ColumnIndex,_true> *)schema,__n);
          sVar11 = pvVar8->index;
          pvVar8 = vector<duckdb::ColumnIndex,_true>::operator[]
                             ((vector<duckdb::ColumnIndex,_true> *)schema,__n);
          vector<duckdb::ParquetColumnSchema,_true>::operator[](this_00,sVar11);
          CreateReaderRecursive
                    ((ParquetReader *)local_78,context,(vector<duckdb::ColumnIndex,_true> *)local_50
                     ,(ParquetColumnSchema *)&pvVar8->child_indexes);
          pvVar9 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
                   ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
                                 *)&local_48,sVar11);
          uVar6 = local_78._0_8_;
          local_78._0_8_ =
               (tuple<duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>)0x0;
          _Var5._M_head_impl =
               (pvVar9->
               super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>).
               _M_t.
               super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>
               .super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl;
          (pvVar9->
          super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)._M_t.
          super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>
          .super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl = (ColumnReader *)uVar6
          ;
          if (_Var5._M_head_impl != (ColumnReader *)0x0) {
            (**(code **)((long)(_Var5._M_head_impl)->_vptr_ColumnReader + 8))();
          }
          if ((ColumnReader *)local_78._0_8_ != (ColumnReader *)0x0) {
            (*(*(_func_int ***)local_78._0_8_)[1])();
          }
          __n = __n + 1;
        } while (__n < (ulong)((long)(schema->name)._M_dataplus._M_p - *(long *)schema >> 5));
      }
      bVar1 = *(byte *)&(in_R8->registered_state).
                        super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                        .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl
      ;
      if (bVar1 - 0x65 < 2) {
        pvVar9 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
                               *)&local_48,0);
        this_02 = (ListColumnReader *)operator_new(0x2e8);
        local_78._0_8_ =
             (pvVar9->
             super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>).
             _M_t.
             super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>
             .super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl;
        (pvVar9->super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
        ._M_t.
        super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
        super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl = (ColumnReader *)0x0;
        ListColumnReader::ListColumnReader
                  (this_02,(ParquetReader *)context,(ParquetColumnSchema *)in_R8,
                   (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                    *)local_78);
        this = (ParquetReader *)local_78._32_8_;
        if ((ColumnReader *)local_78._0_8_ != (ColumnReader *)0x0) {
          (*(*(_func_int ***)local_78._0_8_)[1])();
        }
      }
      else {
        if (bVar1 != 100) {
          pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
          local_78._0_8_ = (long)local_78 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_78,"Unsupported schema type for schema with children","");
          InternalException::InternalException(pIVar10,(string *)local_78);
          __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        this_02 = (ListColumnReader *)operator_new(0x208);
        local_78._0_8_ =
             local_48.
             super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_78._8_8_ =
             local_48.
             super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_78._16_8_ =
             local_48.
             super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_48.
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        StructColumnReader::StructColumnReader
                  ((StructColumnReader *)this_02,(ParquetReader *)context,
                   (ParquetColumnSchema *)in_R8,
                   (vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
                    *)local_78);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                   *)local_78);
        this = (ParquetReader *)local_78._32_8_;
      }
      ((ColumnReader *)this)->_vptr_ColumnReader = (_func_int **)this_02;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      ::~vector(&local_48);
    }
  }
  else if (iVar2 == 1) {
    this_01 = (RowNumberColumnReader *)operator_new(0x1f8);
    RowNumberColumnReader::RowNumberColumnReader
              (this_01,(ParquetReader *)context,(ParquetColumnSchema *)in_R8);
    *(RowNumberColumnReader **)local_78._32_8_ = this_01;
    this = (ParquetReader *)local_78._32_8_;
  }
  else {
    if (iVar2 != 2) {
      pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
      local_78._0_8_ = (long)local_78 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,"Unsupported ParquetColumnSchemaType","");
      InternalException::InternalException(pIVar10,(string *)local_78);
      __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pPVar7 = shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->
                       ((shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)
                        &(context->config).asof_loop_join_threshold);
    reader = (ParquetReader *)
             unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
             ::operator->(&pPVar7->geo_metadata);
    this = (ParquetReader *)local_78._32_8_;
    GeoParquetFileMetadata::CreateColumnReader
              ((GeoParquetFileMetadata *)local_78._32_8_,reader,(ParquetColumnSchema *)context,in_R8
              );
  }
  return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
         (_Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>)this;
}

Assistant:

unique_ptr<ColumnReader> ParquetReader::CreateReaderRecursive(ClientContext &context,
                                                              const vector<ColumnIndex> &indexes,
                                                              const ParquetColumnSchema &schema) {
	switch (schema.schema_type) {
	case ParquetColumnSchemaType::GEOMETRY:
		return metadata->geo_metadata->CreateColumnReader(*this, schema, context);
	case ParquetColumnSchemaType::FILE_ROW_NUMBER:
		return make_uniq<RowNumberColumnReader>(*this, schema);
	case ParquetColumnSchemaType::COLUMN: {
		if (schema.children.empty()) {
			// leaf reader
			return ColumnReader::CreateReader(*this, schema);
		}
		vector<unique_ptr<ColumnReader>> children;
		children.resize(schema.children.size());
		if (indexes.empty()) {
			for (idx_t child_index = 0; child_index < schema.children.size(); child_index++) {
				children[child_index] = CreateReaderRecursive(context, indexes, schema.children[child_index]);
			}
		} else {
			for (idx_t i = 0; i < indexes.size(); i++) {
				auto child_index = indexes[i].GetPrimaryIndex();
				children[child_index] =
				    CreateReaderRecursive(context, indexes[i].GetChildIndexes(), schema.children[child_index]);
			}
		}
		switch (schema.type.id()) {
		case LogicalTypeId::LIST:
		case LogicalTypeId::MAP:
			D_ASSERT(children.size() == 1);
			return make_uniq<ListColumnReader>(*this, schema, std::move(children[0]));
		case LogicalTypeId::STRUCT:
			return make_uniq<StructColumnReader>(*this, schema, std::move(children));
		default:
			throw InternalException("Unsupported schema type for schema with children");
		}
	}
	default:
		throw InternalException("Unsupported ParquetColumnSchemaType");
	}
}